

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O0

rotation_t * opengv::math::quaternion2rot(quaternion_t *q)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  rotation_t *in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *this;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  rotation_t *R;
  Index in_stack_fffffffffffffeb8;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *in_stack_fffffffffffffec0;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0xaca26f);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  dVar3 = (double)this + dVar3;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca350);
  *pSVar2 = (dVar3 - dVar4) - dVar5;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -(dVar5 * *pdVar1);
  auVar7 = vfmadd213sd_fma(auVar13,auVar7,auVar19);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca419);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * *pdVar1;
  auVar7 = vfmadd213sd_fma(auVar14,auVar8,auVar20);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca4cb);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5 * *pdVar1;
  auVar7 = vfmadd213sd_fma(auVar15,auVar9,auVar21);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca580);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar6 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca684);
  *pSVar2 = ((dVar3 - dVar4) + dVar5) - dVar6;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -(dVar5 * *pdVar1);
  auVar7 = vfmadd213sd_fma(auVar16,auVar10,auVar22);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca766);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -(dVar5 * *pdVar1);
  auVar7 = vfmadd213sd_fma(auVar17,auVar11,auVar23);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca847);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 * *pdVar1;
  auVar7 = vfmadd213sd_fma(auVar18,auVar12,auVar24);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xaca912);
  *pSVar2 = auVar7._0_8_ * 2.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar3 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar4 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar5 = pow(*pdVar1,2.0);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (this,in_stack_fffffffffffffeb8);
  dVar6 = pow(*pdVar1,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,
                      in_stack_fffffffffffffeb8,0xacaa16);
  *pSVar2 = ((dVar3 - dVar4) - dVar5) + dVar6;
  return in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::quaternion2rot( const quaternion_t & q)
{
  rotation_t R;

  R(0,0) = pow(q[0],2)+pow(q[1],2)-pow(q[2],2)-pow(q[3],2);
  R(0,1) = 2.0*(q[1]*q[2]-q[0]*q[3]);
  R(0,2) = 2.0*(q[1]*q[3]+q[0]*q[2]);
  R(1,0) = 2.0*(q[1]*q[2]+q[0]*q[3]);
  R(1,1) = pow(q[0],2)-pow(q[1],2)+pow(q[2],2)-pow(q[3],2);
  R(1,2) = 2.0*(q[2]*q[3]-q[0]*q[1]);
  R(2,0) = 2.0*(q[1]*q[3]-q[0]*q[2]);
  R(2,1) = 2.0*(q[2]*q[3]+q[0]*q[1]);
  R(2,2) = pow(q[0],2)-pow(q[1],2)-pow(q[2],2)+pow(q[3],2);

  return R;
}